

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O3

void ImGui_ImplSDL2_UpdateGamepadAnalog
               (ImGui_ImplSDL2_Data *bd,ImGuiIO *io,ImGuiKey key,SDL_GameControllerAxis axis_no,
               float v0,float v1)

{
  short sVar1;
  undefined4 in_register_00000014;
  undefined4 in_R8D;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if ((int)bd == 0) {
    fVar4 = 0.0;
  }
  else {
    lVar2 = 0;
    fVar5 = 0.0;
    do {
      sVar1 = SDL_GameControllerGetAxis(*(undefined8 *)((long)&io->ConfigFlags + lVar2),in_R8D);
      fVar3 = ((float)(int)sVar1 - v0) / (v1 - v0);
      fVar4 = 1.0;
      if (fVar3 <= 1.0) {
        fVar4 = fVar3;
      }
      fVar4 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar4);
      if (fVar4 <= fVar5) {
        fVar4 = fVar5;
      }
      lVar2 = lVar2 + 8;
      fVar5 = fVar4;
    } while ((long)(int)bd * 8 != lVar2);
  }
  ImGuiIO::AddKeyAnalogEvent
            ((ImGuiIO *)CONCAT44(in_register_00000014,key),axis_no,0.1 < fVar4,fVar4);
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateGamepadAnalog(ImGui_ImplSDL2_Data* bd, ImGuiIO& io, ImGuiKey key, SDL_GameControllerAxis axis_no, float v0, float v1)
{
    float merged_value = 0.0f;
    for (SDL_GameController* gamepad : bd->Gamepads)
    {
        float vn = Saturate((float)(SDL_GameControllerGetAxis(gamepad, axis_no) - v0) / (float)(v1 - v0));
        if (merged_value < vn)
            merged_value = vn;
    }
    io.AddKeyAnalogEvent(key, merged_value > 0.1f, merged_value);
}